

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoding.c
# Opt level: O0

exr_result_t
exr_decoding_update(exr_const_context_t ctxt,int part_index,exr_chunk_info_t *cinfo,
                   exr_decode_pipeline_t *decode)

{
  long in_RCX;
  void *in_RDX;
  int in_ESI;
  exr_const_context_t in_RDI;
  exr_const_priv_part_t part;
  exr_coding_channel_info_t *in_stack_00000008;
  exr_result_t rv;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  exr_result_t eVar1;
  
  if (in_RDI == (exr_const_context_t)0x0) {
    eVar1 = 2;
  }
  else if ((in_ESI < 0) || (in_RDI->num_parts <= in_ESI)) {
    eVar1 = 4;
  }
  else if ((in_RDX == (void *)0x0) || (in_RCX == 0)) {
    eVar1 = (*in_RDI->standard_error)(in_RDI,3);
  }
  else if ((*(exr_const_context_t *)(in_RCX + 0x18) == in_RDI) &&
          (*(int *)(in_RCX + 0x14) == in_ESI)) {
    eVar1 = internal_coding_update_channel_info
                      (in_stack_00000008,part._6_2_,
                       (exr_chunk_info_t *)
                       CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                       (exr_const_priv_part_t)CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
    memcpy((void *)(in_RCX + 0x20),in_RDX,0x40);
  }
  else {
    eVar1 = (*in_RDI->report_error)
                      (in_RDI,3,"Invalid request for decoding update from different context / part")
    ;
  }
  return eVar1;
}

Assistant:

exr_result_t
exr_decoding_update (
    exr_const_context_t     ctxt,
    int                     part_index,
    const exr_chunk_info_t* cinfo,
    exr_decode_pipeline_t*  decode)
{
    exr_result_t rv;

    exr_const_priv_part_t part;

    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;
    if (part_index < 0 || part_index >= ctxt->num_parts)
        return EXR_ERR_ARGUMENT_OUT_OF_RANGE;

    if (!cinfo || !decode)
        return ctxt->standard_error (ctxt, EXR_ERR_INVALID_ARGUMENT);

    part = ctxt->parts[part_index];

    if (decode->context != ctxt || decode->part_index != part_index)
        return ctxt->report_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid request for decoding update from different context / part");

    rv = internal_coding_update_channel_info (
        decode->channels, decode->channel_count, cinfo, ctxt, part);
    decode->chunk = *cinfo;

    return rv;
}